

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_vfs_unregister(sqlite3_vfs *pVfs)

{
  sqlite3_vfs *psVar1;
  bool bVar2;
  int iVar3;
  sqlite3_mutex *psVar4;
  sqlite3_vfs **ppsVar5;
  sqlite3_vfs *psVar6;
  
  iVar3 = sqlite3_initialize();
  if (iVar3 != 0) {
    return iVar3;
  }
  bVar2 = true;
  if ((sqlite3Config.bCoreMutex == '\0') ||
     (psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar4 == (sqlite3_mutex *)0x0)) {
    psVar4 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
    bVar2 = false;
  }
  if (pVfs == (sqlite3_vfs *)0x0) goto LAB_00115623;
  if (vfsList == pVfs) {
    ppsVar5 = &vfsList;
  }
  else {
    psVar1 = vfsList;
    if (vfsList == (sqlite3_vfs *)0x0) goto LAB_00115623;
    do {
      psVar6 = psVar1;
      psVar1 = psVar6->pNext;
      if (psVar1 == (sqlite3_vfs *)0x0) break;
    } while (psVar1 != pVfs);
    if (psVar1 != pVfs) goto LAB_00115623;
    ppsVar5 = &psVar6->pNext;
  }
  *ppsVar5 = pVfs->pNext;
LAB_00115623:
  if (!bVar2) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_vfs_unregister(sqlite3_vfs *pVfs){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}